

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.h
# Opt level: O2

StellaOutputProxy __thiscall
stella::detail::StellaOutput::operator<<(StellaOutput *this,char (*obj) [15])

{
  int iVar1;
  char (*in_RDX) [15];
  int l;
  int iVar2;
  
  iVar1 = *(int *)(*obj + 8);
  if (*(int *)(*obj + 0xc) < iVar1) {
    this->pOut_ = (ostream *)0x0;
  }
  else {
    for (iVar2 = 1; iVar2 < iVar1; iVar2 = iVar2 + 1) {
      std::operator<<(*(ostream **)*obj,"  ");
      iVar1 = *(int *)(*obj + 8);
    }
    if (1 < iVar1) {
      std::operator<<(*(ostream **)*obj," -- ");
    }
    this->pOut_ = *(ostream **)*obj;
    StellaOutputProxy::operator<<((StellaOutputProxy *)this,in_RDX);
  }
  return (StellaOutputProxy)(ostream *)this;
}

Assistant:

StellaOutputProxy operator<<(const T& obj)
    {
        if (level_ > maxlevel_)
            return StellaOutputProxy();

        for (int l = 1; l < level_; ++l)
            (*pOut_) << "  ";

        if (level_ > 1) (*pOut_) << " -- ";

        StellaOutputProxy proxy;
        proxy.Init(*pOut_);
        proxy << obj;
        return proxy;
    }